

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O0

int plugin_loader_symbol_iface_suffix(plugin_loader_conflict l,char *name,size_t name_length)

{
  undefined1 *puVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  char *result;
  size_t suffix_length;
  uint local_4;
  
  puVar1 = (undefined1 *)malloc(in_RDX + 0x1b);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x5f;
    memcpy(puVar1 + 1,in_RSI,in_RDX);
    memcpy(puVar1 + in_RDX + 1,"_impl_interface_singleton",0x19);
    puVar1[in_RDX + 0x1a] = 0;
    *(undefined1 **)(in_RDI + 0x10) = puVar1;
  }
  else {
    log_write_impl_va("metacall",0x67,"plugin_loader_symbol_iface_suffix",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                      ,3,"Invalid plugin loader symbol suffix allocation");
  }
  local_4 = (uint)(puVar1 == (undefined1 *)0x0);
  return local_4;
}

Assistant:

int plugin_loader_symbol_iface_suffix(plugin_loader l, const char *name, size_t name_length)
{
	/* This generates a suffix string for accessing the entry point of a plugin (the interface symbol) */
	/* They are in the form of: [dynlink_symbol_]<plugin_name>_<manager_name>_impl_interface_singleton */
	/* For example, in Linux: dynlink_symbol_rapid_json_serial_impl_interface_singleton */

	static const char suffix[] = "_impl_interface_singleton";
	size_t suffix_length = sizeof(suffix) - 1;
	char *result = malloc(sizeof(char) * (name_length + suffix_length + 2)); /* 2: for the _ at the begining and \0 at the end */

	if (result == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin loader symbol suffix allocation");
		return 1;
	}

	result[0] = '_';

	memcpy(&result[1], name, name_length);

	memcpy(&result[1 + name_length], suffix, suffix_length);

	result[1 + name_length + suffix_length] = '\0';

	l->symbol_iface_suffix = result;

	return 0;
}